

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O1

void __thiscall
iDynTree::AttitudeQuaternionEKF::prepareSystemNoiseCovarianceMatrix
          (AttitudeQuaternionEKF *this,MatrixDynSize *Q)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  size_t sVar4;
  ulong uVar5;
  PointerType pdVar6;
  long lVar7;
  PointerType pdVar8;
  long lVar9;
  PointerType pdVar10;
  long lVar11;
  MatrixDynSize Fu_dyn;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> Q_;
  Matrix6x6 U_dyn;
  assign_op<double,_double> local_1f1;
  long local_1f0;
  MatrixDynSize local_1e8 [40];
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_1c0;
  double local_1a0 [21];
  double adStack_f8 [15];
  undefined1 local_80 [48];
  PointerType local_50;
  variable_if_dynamic<long,__1> local_48;
  variable_if_dynamic<long,__1> local_40;
  
  sVar4 = iDynTree::MatrixDynSize::rows();
  if (sVar4 != this->m_state_size) {
    uVar5 = iDynTree::MatrixDynSize::cols();
    if (uVar5 != this->m_state_size) {
      iDynTree::MatrixDynSize::resize((ulong)Q,this->m_state_size);
    }
  }
  iDynTree::MatrixDynSize::MatrixDynSize(local_1e8,this->m_state_size,this->m_input_size + 3);
  iDynTree::MatrixDynSize::zero();
  memset(local_1a0,0,0x120);
  pdVar6 = (PointerType)iDynTree::MatrixDynSize::data();
  local_1f0 = iDynTree::MatrixDynSize::rows();
  lVar7 = iDynTree::MatrixDynSize::cols();
  pdVar8 = (PointerType)iDynTree::MatrixDynSize::data();
  lVar9 = iDynTree::MatrixDynSize::rows();
  local_1c0.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_cols.m_value = iDynTree::MatrixDynSize::cols();
  pdVar10 = pdVar6 + lVar7 * 4 + 2;
  lVar11 = 0;
  do {
    pdVar1 = (double *)((long)(this->m_Id3).m_data + lVar11);
    dVar2 = pdVar1[1];
    pdVar10[-2] = *pdVar1;
    pdVar10[-1] = dVar2;
    *pdVar10 = *(double *)((long)(this->m_Id3).m_data + lVar11 + 0x10);
    lVar11 = lVar11 + 0x18;
    pdVar10 = pdVar10 + lVar7;
  } while (lVar11 != 0x48);
  pdVar10 = pdVar6 + lVar7 * 7 + 5;
  lVar11 = 0;
  do {
    pdVar1 = (double *)((long)(this->m_Id3).m_data + lVar11);
    dVar2 = pdVar1[1];
    pdVar10[-2] = *pdVar1;
    pdVar10[-1] = dVar2;
    *pdVar10 = *(double *)((long)(this->m_Id3).m_data + lVar11 + 0x10);
    lVar11 = lVar11 + 0x18;
    pdVar10 = pdVar10 + lVar7;
  } while (lVar11 != 0x48);
  dVar2 = (this->m_params_qekf).gyroscope_noise_variance;
  lVar11 = 0;
  do {
    pdVar1 = (double *)((long)(this->m_Id3).m_data + lVar11);
    dVar3 = pdVar1[1];
    *(double *)((long)local_1a0 + lVar11 * 2) = *pdVar1 * dVar2;
    *(double *)((long)local_1a0 + lVar11 * 2 + 8) = dVar3 * dVar2;
    *(double *)((long)local_1a0 + lVar11 * 2 + 0x10) =
         *(double *)((long)(this->m_Id3).m_data + lVar11 + 0x10) * dVar2;
    lVar11 = lVar11 + 0x18;
  } while (lVar11 != 0x48);
  dVar2 = (this->m_params_qekf).gyro_bias_noise_variance;
  lVar11 = 0;
  do {
    pdVar1 = (double *)((long)(this->m_Id3).m_data + lVar11);
    dVar3 = pdVar1[1];
    *(double *)((long)adStack_f8 + lVar11 * 2) = *pdVar1 * dVar2;
    *(double *)((long)adStack_f8 + lVar11 * 2 + 8) = dVar3 * dVar2;
    *(double *)((long)adStack_f8 + lVar11 * 2 + 0x10) =
         *(double *)((long)(this->m_Id3).m_data + lVar11 + 0x10) * dVar2;
    lVar11 = lVar11 + 0x18;
  } while (lVar11 != 0x48);
  local_80._8_8_ = local_1f0;
  local_80._32_8_ = local_1a0;
  local_48.m_value = local_1f0;
  local_1c0.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = pdVar8;
  local_1c0.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_rows.m_value = lVar9;
  local_80._0_8_ = pdVar6;
  local_80._16_8_ = lVar7;
  local_50 = pdVar6;
  local_40.m_value = lVar7;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,0>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>>,0>,Eigen::internal::assign_op<double,double>>
            (&local_1c0,
             (Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>
              *)local_80,&local_1f1,(type)0x0);
  iDynTree::MatrixDynSize::~MatrixDynSize(local_1e8);
  return;
}

Assistant:

void iDynTree::AttitudeQuaternionEKF::prepareSystemNoiseCovarianceMatrix(iDynTree::MatrixDynSize &Q)
{
    using iDynTree::toEigen;

    if (Q.rows() != m_state_size && Q.cols() != m_state_size)
    {
        Q.resize(m_state_size, m_state_size);
    }


    iDynTree::MatrixDynSize Fu_dyn(m_state_size, m_input_size + m_state_qekf.m_gyroscope_bias.size());
    Fu_dyn.zero();
    iDynTree::Matrix6x6 U_dyn;
    U_dyn.zero();

    auto F_u(toEigen(Fu_dyn));
    auto U(toEigen(U_dyn));
    auto Id3(toEigen(m_Id3));
    auto Q_(toEigen(Q));

    F_u.block<3, 3>(4, 0) = Id3;
    F_u.block<3,3>(7, 3) = Id3;

    U.block<3, 3>(0, 0) = Id3*m_params_qekf.gyroscope_noise_variance;
    U.block<3, 3>(3, 3) = Id3*m_params_qekf.gyro_bias_noise_variance;

    Q_ = F_u*U*F_u.transpose();
}